

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O2

Node * __thiscall
TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::FindKey
          (TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_> *this,
          FName *key)

{
  IPair *pIVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar3 = this->Nodes + (this->Size - 1 & key->Index);
  while( true ) {
    if (pNVar3 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar2 = pNVar3;
    if (pNVar3->Next == (Node *)0x1) break;
    pIVar1 = &pNVar3->Pair;
    pNVar3 = pNVar3->Next;
    if ((pIVar1->Key).Index == key->Index) {
      return pNVar2;
    }
  }
  return (Node *)0x0;
}

Assistant:

FName (const FName &other) { Index = other.Index; }